

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O2

void __thiscall
SuffixTest_ConversionToSuffix_Test::~SuffixTest_ConversionToSuffix_Test
          (SuffixTest_ConversionToSuffix_Test *this)

{
  SuffixTest::~SuffixTest(&this->super_SuffixTest);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(SuffixTest, ConversionToSuffix) {
  // Test that BasicSuffix is not convertible to Suffix&. If it was
  // convertible there would be an error because of an ambiguous call.
  // The conversion is forbidden because it compromises type safety
  // as illustrated in the following example:
  //   auto i = suffixes.Add<int>("a", 0, 1);
  //   auto d = suffixes.Add<double>("b", 0, 1);
  //   Suffix &s = i;
  //   s = d;
  struct Test {
    static void f(Suffix) {}
    static void f(Suffix &) {}
  };
  auto s = suffixes_.Add<int>("a", 0, 1);
  Test::f(s);
  struct MutTest {
    static void f(mp::MutSuffix) {}
    static void f(mp::MutSuffix &) {}
  };
  MutTest::f(s);
}